

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_dup_common(lyd_node *parent,lyd_node *new,lyd_node *orig,ly_ctx *ctx)

{
  byte bVar1;
  uint16_t uVar2;
  lys_node *plVar3;
  byte bVar4;
  int iVar5;
  lys_module *plVar6;
  size_t sVar7;
  lys_node *plVar8;
  lyd_attr *plVar9;
  lyd_attr *plVar10;
  char *pcVar11;
  lyd_val lVar12;
  undefined8 *puVar13;
  LY_ERR *pLVar14;
  ly_ctx *ctx_00;
  lyd_attr *plVar15;
  
  if (ctx == (ly_ctx *)0x0) {
    new->schema = orig->schema;
LAB_00162ca3:
    new->attr = (lyd_attr *)0x0;
    for (plVar15 = orig->attr; plVar15 != (lyd_attr *)0x0; plVar15 = plVar15->next) {
      ctx_00 = ctx;
      if (ctx == (ly_ctx *)0x0) {
        ctx_00 = orig->schema->module->ctx;
      }
      plVar10 = new->attr;
      if (new->attr == (lyd_attr *)0x0) {
        plVar10 = (lyd_attr *)malloc(0x38);
        new->attr = plVar10;
      }
      else {
        do {
          plVar9 = plVar10;
          plVar10 = plVar9->next;
        } while (plVar10 != (lyd_attr *)0x0);
        plVar10 = (lyd_attr *)calloc(1,0x38);
        plVar9->next = plVar10;
      }
      if (plVar10 == (lyd_attr *)0x0) {
        pLVar14 = ly_errno_location();
        *pLVar14 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_dup_attr");
        goto LAB_00162df5;
      }
      plVar10->parent = new;
      plVar10->next = (lyd_attr *)0x0;
      plVar10->annotation = plVar15->annotation;
      pcVar11 = lydict_insert(ctx_00,plVar15->name,0);
      plVar10->name = pcVar11;
      lVar12.binary = lydict_insert(ctx_00,plVar15->value_str,0);
      plVar10->value_str = (char *)lVar12;
      uVar2 = plVar15->value_type;
      plVar10->value_type = uVar2;
      switch(uVar2) {
      case 1:
      case 10:
        break;
      case 2:
      case 6:
      case 7:
        puVar13 = (undefined8 *)
                  lys_ext_complex_get_substmt
                            (LY_STMT_TYPE,plVar10->annotation,(lyext_substmt **)0x0);
        lyp_parse_value((lys_type *)*puVar13,&plVar10->value_str,(lyxml_elem *)0x0,
                        (lyd_node_leaf_list *)0x0,plVar10,1,0);
        goto LAB_00162df5;
      default:
        lVar12 = plVar15->value;
        break;
      case 8:
      case 9:
        (plVar10->value).binary = (char *)0x0;
        goto LAB_00162df5;
      case 0xb:
        lVar12.binary = lydict_insert(ctx_00,(plVar15->value).binary,0);
      }
      (plVar10->value).binary = (char *)lVar12;
LAB_00162df5:
    }
    new->next = (lyd_node *)0x0;
    new->prev = new;
    new->parent = (lyd_node *)0x0;
    iVar5 = ly_new_node_validity(new->schema);
    new->validity = (uint8_t)iVar5;
    bVar4 = orig->field_0x9 & 1;
    bVar1 = new->field_0x9;
    new->field_0x9 = bVar1 & 0xfe | bVar4;
    new->field_0x9 = bVar1 & 0xf0 | bVar4 | orig->field_0x9 & 8;
    if ((parent != (lyd_node *)0x0) && (iVar5 = lyd_insert(parent,new), iVar5 != 0)) {
      return 1;
    }
    iVar5 = 0;
  }
  else {
    if (parent == (lyd_node *)0x0) {
      plVar8 = lys_get_schema_inctx(orig->schema,ctx);
      new->schema = plVar8;
LAB_00162c99:
      if (new->schema != (lys_node *)0x0) goto LAB_00162ca3;
      pLVar14 = ly_errno_location();
      *pLVar14 = LY_EINVAL;
      ly_log(LY_LLERR,
             "Target context does not contain schema node for the data node being duplicated (%s:%s)."
             ,orig->schema->module->name,orig->schema->name);
    }
    else {
      plVar6 = lys_node_module(parent->schema);
      pcVar11 = orig->schema->module->name;
      sVar7 = strlen(pcVar11);
      plVar6 = lys_get_import_module(plVar6,(char *)0x0,0,pcVar11,(int)sVar7);
      if (plVar6 != (lys_module *)0x0) {
        plVar8 = parent->schema->child;
        plVar3 = orig->schema;
        pcVar11 = plVar3->name;
        sVar7 = strlen(pcVar11);
        lys_get_data_sibling(plVar6,plVar8,pcVar11,(int)sVar7,plVar3->nodetype,&new->schema);
        goto LAB_00162c99;
      }
      pLVar14 = ly_errno_location();
      *pLVar14 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
             ,0x1178);
    }
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

static int
lyd_dup_common(struct lyd_node *parent, struct lyd_node *new, const struct lyd_node *orig, struct ly_ctx *ctx)
{
    struct lyd_attr *attr;
    const struct lys_module *trg_mod;

    /* fill common part */
    if (ctx) {
        /* we are changing the context, so we have to get the correct schema node in the new context */
        if (parent) {
            trg_mod = lys_get_import_module(lys_node_module(parent->schema), NULL, 0, orig->schema->module->name,
                                            strlen(orig->schema->module->name));
            if (!trg_mod) {
                LOGINT;
                return EXIT_FAILURE;
            }
            /* we know its parent, so we can start with it */
            lys_get_data_sibling(trg_mod, parent->schema->child, orig->schema->name, strlen(orig->schema->name),
                                 orig->schema->nodetype, (const struct lys_node **)&new->schema);
        } else {
            /* we have to search in complete context */
            new->schema = lyd_get_schema_inctx(orig, ctx);
        }

        if (!new->schema) {
            LOGERR(LY_EINVAL, "Target context does not contain schema node for the data node being duplicated "
                   "(%s:%s).", orig->schema->module->name, orig->schema->name);
            return EXIT_FAILURE;
        }
    } else {
        /* the context is the same so also the pointer into the schema will be the same */
        new->schema = orig->schema;
    }
    new->attr = NULL;
    LY_TREE_FOR(orig->attr, attr) {
        lyd_dup_attr(ctx ? ctx : orig->schema->module->ctx, new, attr);
    }
    new->next = NULL;
    new->prev = new;
    new->parent = NULL;
    new->validity = ly_new_node_validity(new->schema);
    new->dflt = orig->dflt;
    new->when_status = orig->when_status & LYD_WHEN;

    if (parent && lyd_insert(parent, new)) {
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}